

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::Prim::set_primdata<tinyusdz::Model>(Prim *this,string *elementName,Model *prim)

{
  allocator local_109;
  string local_108;
  Path local_e8;
  
  linb::any::operator=(&(this->_data).v_,prim);
  SetPrimElementName(&this->_data,elementName);
  std::__cxx11::string::string((string *)&local_108,"",&local_109);
  Path::Path(&local_e8,elementName,&local_108);
  Path::operator=(&this->_elementPath,&local_e8);
  Path::~Path(&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  return;
}

Assistant:

void set_primdata(const std::string &elementName, const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    SetPrimElementName(_data, elementName);
    _elementPath = Path(elementName, "");
  }